

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
zeGetRTASParallelOperationProcAddrTable
          (ze_api_version_t version,ze_rtas_parallel_operation_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_pfnRTASParallelOperationCreateExt_t p_Var3;
  ze_pfnRTASParallelOperationGetPropertiesExt_t p_Var4;
  ze_pfnRTASParallelOperationDestroyExt_t p_Var5;
  int iVar6;
  ze_result_t zVar7;
  code *pcVar8;
  bool bVar9;
  iterator __begin1;
  undefined8 *puVar10;
  ze_rtas_parallel_operation_dditable_t dditable;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  puVar10 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 == puVar10) {
LAB_001abb83:
    zVar7 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (pDdiTable == (ze_rtas_parallel_operation_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    bVar9 = false;
    do {
      while ((*(int *)(puVar10 + 1) != 0 ||
             (pcVar8 = (code *)dlsym(*puVar10,"zeGetRTASParallelOperationProcAddrTable"),
             pcVar8 == (code *)0x0))) {
LAB_001aba39:
        puVar10 = puVar10 + 0x1b3;
        if (puVar10 == puVar1) {
          if (!bVar9) goto LAB_001abb83;
          goto LAB_001aba6c;
        }
      }
      iVar6 = (*pcVar8)(version,puVar10 + 0xc);
      if (iVar6 != 0) {
        *(int *)(puVar10 + 1) = iVar6;
        goto LAB_001aba39;
      }
      puVar10 = puVar10 + 0x1b3;
      bVar9 = true;
    } while (puVar10 != puVar1);
LAB_001aba6c:
    lVar2 = *(long *)(loader::context + 0x15e0);
    if (((ulong)((*(long *)(loader::context + 0x15e8) - lVar2 >> 3) * 0x7aff6957aff6957b) < 2) &&
       (*(char *)(loader::context + 0x1629) != '\x01')) {
      p_Var3 = *(ze_pfnRTASParallelOperationCreateExt_t *)(lVar2 + 0x60);
      p_Var4 = *(ze_pfnRTASParallelOperationGetPropertiesExt_t *)(lVar2 + 0x68);
      p_Var5 = *(ze_pfnRTASParallelOperationDestroyExt_t *)(lVar2 + 0x78);
      pDdiTable->pfnJoinExt = *(ze_pfnRTASParallelOperationJoinExt_t *)(lVar2 + 0x70);
      pDdiTable->pfnDestroyExt = p_Var5;
      pDdiTable->pfnCreateExt = p_Var3;
      pDdiTable->pfnGetPropertiesExt = p_Var4;
    }
    else {
      pDdiTable->pfnCreateExt = loader::zeRTASParallelOperationCreateExt;
      pDdiTable->pfnGetPropertiesExt = loader::zeRTASParallelOperationGetPropertiesExt;
      pDdiTable->pfnJoinExt = loader::zeRTASParallelOperationJoinExt;
      pDdiTable->pfnDestroyExt = loader::zeRTASParallelOperationDestroyExt;
    }
    if (*(long *)(loader::context + 0x1618) != 0) {
      pcVar8 = (code *)dlsym(*(long *)(loader::context + 0x1618),
                             "zeGetRTASParallelOperationProcAddrTable");
      if (pcVar8 == (code *)0x0) goto LAB_001abb83;
      zVar7 = (*pcVar8)(version,pDdiTable);
      if (zVar7 != ZE_RESULT_SUCCESS) {
        return zVar7;
      }
    }
    if (*(long *)(loader::context + 0x1620) == 0) {
      zVar7 = ZE_RESULT_SUCCESS;
    }
    else {
      pcVar8 = (code *)dlsym(*(long *)(loader::context + 0x1620),
                             "zeGetRTASParallelOperationProcAddrTable");
      zVar7 = ZE_RESULT_ERROR_UNINITIALIZED;
      if (pcVar8 != (code *)0x0) {
        local_58 = *(undefined4 *)&pDdiTable->pfnCreateExt;
        uStack_54 = *(undefined4 *)((long)&pDdiTable->pfnCreateExt + 4);
        uStack_50 = *(undefined4 *)&pDdiTable->pfnGetPropertiesExt;
        uStack_4c = *(undefined4 *)((long)&pDdiTable->pfnGetPropertiesExt + 4);
        local_48 = *(undefined4 *)&pDdiTable->pfnJoinExt;
        uStack_44 = *(undefined4 *)((long)&pDdiTable->pfnJoinExt + 4);
        uStack_40 = *(undefined4 *)&pDdiTable->pfnDestroyExt;
        uStack_3c = *(undefined4 *)((long)&pDdiTable->pfnDestroyExt + 4);
        zVar7 = (*pcVar8)(version,&local_58);
        lVar2 = loader::context;
        *(undefined4 *)(loader::context + 0x16a8) = local_58;
        *(undefined4 *)(lVar2 + 0x16ac) = uStack_54;
        *(undefined4 *)(lVar2 + 0x16b0) = uStack_50;
        *(undefined4 *)(lVar2 + 0x16b4) = uStack_4c;
        *(undefined4 *)(lVar2 + 0x16b8) = local_48;
        *(undefined4 *)(lVar2 + 0x16bc) = uStack_44;
        *(undefined4 *)(lVar2 + 0x16c0) = uStack_40;
        *(undefined4 *)(lVar2 + 0x16c4) = uStack_3c;
        if (*(char *)(lVar2 + 0x1652) == '\x01') {
          zVar7 = (*pcVar8)(version,pDdiTable);
        }
      }
    }
  }
  return zVar7;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetRTASParallelOperationProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_rtas_parallel_operation_dditable_t* pDdiTable///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetRTASParallelOperationProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.ze.RTASParallelOperation);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnCreateExt                                = loader::zeRTASParallelOperationCreateExt;
            pDdiTable->pfnGetPropertiesExt                         = loader::zeRTASParallelOperationGetPropertiesExt;
            pDdiTable->pfnJoinExt                                  = loader::zeRTASParallelOperationJoinExt;
            pDdiTable->pfnDestroyExt                               = loader::zeRTASParallelOperationDestroyExt;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.RTASParallelOperation;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetRTASParallelOperationProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetRTASParallelOperationProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_rtas_parallel_operation_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_rtas_parallel_operation_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.RTASParallelOperation = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}